

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.c
# Opt level: O3

size_t utf8_check_first(char byte)

{
  size_t sVar1;
  
  sVar1 = 1;
  if (byte < '\0') {
    if ((byte & 0xfeU) == 0xc0 || (byte)byte < 0xc0) {
      return 0;
    }
    sVar1 = 2;
    if ((0xdf < (byte)byte) && (sVar1 = 3, 0xef < (byte)byte)) {
      return (ulong)((byte)byte < 0xf5) << 2;
    }
  }
  return sVar1;
}

Assistant:

size_t utf8_check_first(char byte)
{
    unsigned char u = (unsigned char)byte;

    if(u < 0x80)
        return 1;

    if(0x80 <= u && u <= 0xBF) {
        /* second, third or fourth byte of a multi-byte
           sequence, i.e. a "continuation byte" */
        return 0;
    }
    else if(u == 0xC0 || u == 0xC1) {
        /* overlong encoding of an ASCII byte */
        return 0;
    }
    else if(0xC2 <= u && u <= 0xDF) {
        /* 2-byte sequence */
        return 2;
    }

    else if(0xE0 <= u && u <= 0xEF) {
        /* 3-byte sequence */
        return 3;
    }
    else if(0xF0 <= u && u <= 0xF4) {
        /* 4-byte sequence */
        return 4;
    }
    else { /* u >= 0xF5 */
        /* Restricted (start of 4-, 5- or 6-byte sequence) or invalid
           UTF-8 */
        return 0;
    }
}